

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

int Wla_ManShrinkAbs(Wla_Man_t *pWla,int nFrames,int RunId)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Vec_Int_t *vBlacks;
  Vec_Int_t *vPPIs;
  ulong uVar12;
  Wlc_Ntk_t *pWVar13;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  size_t sVar14;
  char *pcVar15;
  Gia_Obj_t *pGVar16;
  Gia_Man_t *pFrames;
  Vec_Int_t *pVVar17;
  int *piVar18;
  Vec_Int_t *pVVar19;
  int iVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  Vec_Bit_t *pVVar25;
  char *__assertion;
  uint in_R9D;
  Gia_Obj_t *pGVar26;
  ulong uVar27;
  Gia_Obj_t *pGVar28;
  timespec ts;
  Wlc_Par_t *in_stack_ffffffffffffff68;
  long local_68;
  timespec local_58;
  Wla_Man_t *local_48;
  Wlc_Ntk_t *local_40;
  Gia_Obj_t *local_38;
  
  vBlacks = Wla_ManCollectNodes(pWla,0);
  vPPIs = Wla_ManCollectNodes(pWla,1);
  pWVar13 = pWla->p;
  local_48 = pWla;
  iVar8 = clock_gettime(3,&local_58);
  if (iVar8 < 0) {
    local_68 = 1;
  }
  else {
    lVar22 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_68 = ((lVar22 >> 7) - (lVar22 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if ((vBlacks == (Vec_Int_t *)0x0) || (uVar12 = (ulong)(uint)vBlacks->nSize, uVar12 == 0)) {
    __assert_fail("vWhites && Vec_IntSize(vWhites)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x2b4,
                  "Vec_Bit_t *Wlc_NtkProofReduce(Wlc_Ntk_t *, Wlc_Par_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  pWVar13 = Wlc_NtkIntroduceChoices(pWVar13,vBlacks,vPPIs);
  iVar8 = Wlc_NtkNumPiBits(pWVar13);
  pcVar15 = (char *)0x0;
  local_40 = pWVar13;
  p = Wlc_NtkBitBlast(pWVar13,(Wlc_BstPar_t *)0x0);
  p_00 = Gia_ManStart(10000);
  pcVar21 = p->pName;
  if (pcVar21 != (char *)0x0) {
    sVar14 = strlen(pcVar21);
    pcVar15 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar15,pcVar21);
  }
  p_00->pName = pcVar15;
  Gia_ManHashAlloc(p_00);
  pGVar28 = p->pObjs;
  pGVar28->Value = 0;
  lVar22 = (long)p->nRegs;
  if (0 < lVar22) {
    pVVar17 = p->vCos;
    iVar9 = pVVar17->nSize;
    uVar10 = iVar9 - p->nRegs;
    do {
      in_R9D = uVar10;
      if (((int)in_R9D < 0) || (iVar9 <= (int)in_R9D)) {
LAB_00887a9d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = pVVar17->pArray[in_R9D];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_00887a5f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar28 == (Gia_Obj_t *)0x0) break;
      pGVar28[iVar11].Value = 0;
      lVar22 = lVar22 + -1;
      uVar10 = in_R9D + 1;
    } while (lVar22 != 0);
  }
  iVar9 = iVar8 - (int)uVar12;
  if (0 < nFrames) {
    pGVar28 = (Gia_Obj_t *)(long)iVar9;
    iVar11 = 0;
    do {
      pVVar17 = p->vCis;
      uVar2 = pVVar17->nSize;
      uVar10 = p->nRegs;
      iVar20 = uVar2 - uVar10;
      if (iVar20 != 0 && (int)uVar10 <= (int)uVar2) {
        lVar22 = 0;
        do {
          if ((iVar8 <= lVar22 || lVar22 < (long)pGVar28) || (iVar11 == 0)) {
            pGVar16 = Gia_ManAppendObj(p_00);
            uVar27 = *(ulong *)pGVar16;
            *(ulong *)pGVar16 = uVar27 | 0x9fffffff;
            *(ulong *)pGVar16 =
                 uVar27 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar26 = p_00->pObjs;
            if ((pGVar16 < pGVar26) || (pGVar26 + p_00->nObjs <= pGVar16)) {
LAB_00887a7e:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar16 - (long)pGVar26) >> 2) * -0x55555555)
            ;
            pGVar26 = p_00->pObjs;
            if ((pGVar16 < pGVar26) || (pGVar26 + p_00->nObjs <= pGVar16)) goto LAB_00887a7e;
            lVar23 = (long)p->vCis->nSize;
            if (lVar23 - p->nRegs <= lVar22) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (lVar23 <= lVar22) goto LAB_00887a9d;
            uVar10 = p->vCis->pArray[lVar22];
            if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) goto LAB_00887a5f;
            p->pObjs[uVar10].Value = (int)((ulong)((long)pGVar16 - (long)pGVar26) >> 2) * 0x55555556
            ;
          }
          lVar22 = lVar22 + 1;
          pVVar17 = p->vCis;
          uVar2 = pVVar17->nSize;
          uVar10 = p->nRegs;
          iVar20 = uVar2 - uVar10;
        } while (lVar22 < iVar20);
      }
      pGVar26 = (Gia_Obj_t *)(ulong)uVar2;
      if (0 < (int)uVar10) {
        pVVar19 = p->vCos;
        iVar3 = pVVar19->nSize;
        uVar24 = iVar3 - uVar10;
        lVar22 = (long)iVar20;
        local_38 = (Gia_Obj_t *)(long)(int)uVar2;
        uVar27 = (ulong)uVar10;
        pGVar26 = local_38;
        do {
          if (((int)uVar24 < 0) || (iVar3 <= (int)uVar24)) goto LAB_00887a9d;
          iVar4 = pVVar19->pArray[uVar24];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00887a5f;
          pGVar16 = p->pObjs;
          if (pGVar16 == (Gia_Obj_t *)0x0) break;
          if ((iVar20 < 0) || ((long)local_38 <= lVar22)) goto LAB_00887a9d;
          iVar5 = pVVar17->pArray[lVar22];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00887a5f;
          pGVar16[iVar5].Value = pGVar16[iVar4].Value;
          lVar22 = lVar22 + 1;
          uVar24 = uVar24 + 1;
          uVar27 = uVar27 - 1;
          pGVar26 = pGVar28;
        } while (uVar27 != 0);
      }
      iVar20 = p->nObjs;
      if ((0 < iVar20) && (pGVar16 = p->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
        lVar22 = 0;
        do {
          uVar27 = *(ulong *)pGVar16;
          if ((uVar27 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar27) {
            if ((int)pGVar16[-(uVar27 & 0x1fffffff)].Value < 0) goto LAB_00887abc;
            uVar10 = (uint)(uVar27 >> 0x20);
            if ((int)pGVar16[-(ulong)(uVar10 & 0x1fffffff)].Value < 0) goto LAB_00887abc;
            uVar10 = Gia_ManHashAnd(p_00,pGVar16[-(uVar27 & 0x1fffffff)].Value ^
                                         (uint)(uVar27 >> 0x1d) & 1,
                                    pGVar16[-(ulong)(uVar10 & 0x1fffffff)].Value ^
                                    uVar10 >> 0x1d & 1);
            pGVar16->Value = uVar10;
          }
          lVar22 = lVar22 + 1;
          iVar20 = p->nObjs;
        } while ((lVar22 < iVar20) && (pGVar16 = p->pObjs + lVar22, p->pObjs != (Gia_Obj_t *)0x0));
      }
      pVVar17 = p->vCos;
      iVar3 = pVVar17->nSize;
      lVar22 = (long)iVar3;
      if (0 < lVar22) {
        piVar18 = pVVar17->pArray;
        lVar23 = 0;
        do {
          iVar4 = piVar18[lVar23];
          if (((long)iVar4 < 0) || (iVar20 <= iVar4)) goto LAB_00887a5f;
          pGVar26 = p->pObjs;
          if (pGVar26 == (Gia_Obj_t *)0x0) break;
          pGVar16 = pGVar26 + iVar4;
          if ((int)pGVar16[-(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff)].Value < 0)
          goto LAB_00887abc;
          uVar10 = (uint)*(undefined8 *)pGVar16 >> 0x1d & 1 ^
                   pGVar16[-(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff)].Value;
          pGVar26 = (Gia_Obj_t *)(ulong)uVar10;
          pGVar16->Value = uVar10;
          lVar23 = lVar23 + 1;
        } while (lVar22 != lVar23);
      }
      in_R9D = (uint)pGVar26;
      if (p->nRegs < iVar3) {
        lVar23 = 0;
        do {
          in_R9D = (uint)pGVar26;
          if ((int)lVar22 <= lVar23) goto LAB_00887a9d;
          iVar20 = pVVar17->pArray[lVar23];
          if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) goto LAB_00887a5f;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p_00,p->pObjs[iVar20].Value);
          in_R9D = (uint)pGVar26;
          lVar23 = lVar23 + 1;
          pVVar17 = p->vCos;
          lVar22 = (long)pVVar17->nSize;
        } while (lVar23 < lVar22 - p->nRegs);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFrames);
  }
  Gia_ManHashStop(p_00);
  piVar18 = (int *)0x0;
  Gia_ManSetRegNum(p_00,0);
  pFrames = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  Gia_ManStop(p);
  iVar8 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  pVVar17 = (Vec_Int_t *)malloc(0x10);
  ((Vec_Bit_t *)pVVar17)->nSize = 0;
  iVar11 = iVar8 * 0x20;
  ((Vec_Bit_t *)pVVar17)->nCap = iVar11;
  if (iVar8 != 0) {
    piVar18 = (int *)malloc((long)iVar8 * 4);
  }
  ((Vec_Bit_t *)pVVar17)->pArray = piVar18;
  ((Vec_Bit_t *)pVVar17)->nSize = iVar11;
  memset(piVar18,0xff,(long)iVar8 << 2);
  pVVar19 = Wlc_NtkGetCoreSels(pFrames,iVar9,(int)uVar12,(int)pVVar17,
                               (Vec_Bit_t *)(ulong)(uint)RunId,in_R9D,in_stack_ffffffffffffff68,
                               (int)uVar12,iVar9);
  Wlc_NtkFree(local_40);
  Gia_ManStop(pFrames);
  if (pVVar19 == (Vec_Int_t *)0x0) {
    pVVar17 = (Vec_Int_t *)0x0;
  }
  else {
    if (0 < iVar8) {
      memset(piVar18,0,(ulong)(iVar8 - 1) * 4 + 4);
    }
    iVar8 = pVVar19->nSize;
    if (0 < (long)iVar8) {
      piVar6 = pVVar19->pArray;
      lVar22 = 0;
      do {
        uVar10 = piVar6[lVar22];
        if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_00887afa;
        piVar18[uVar10 >> 5] = piVar18[uVar10 >> 5] | 1 << ((byte)uVar10 & 0x1f);
        lVar22 = lVar22 + 1;
      } while (iVar8 != lVar22);
    }
    pVVar25 = (Vec_Bit_t *)pVVar17;
    iVar8 = Vec_BitCount((Vec_Bit_t *)pVVar17);
    Abc_Print((int)pVVar25,"ProofReduce: remove %d out of %d white boxes.",
              (ulong)(uint)((int)uVar12 - iVar8));
    iVar9 = 3;
    iVar8 = clock_gettime(3,&local_58);
    if (iVar8 < 0) {
      lVar22 = -1;
    }
    else {
      lVar22 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar9,"%s ="," Time");
    Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar22 + local_68) / 1000000.0);
    if (pVVar19->pArray != (int *)0x0) {
      free(pVVar19->pArray);
      pVVar19->pArray = (int *)0x0;
    }
    free(pVVar19);
  }
  if (pVVar17 == (Vec_Int_t *)0x0) {
    if (vBlacks->pArray != (int *)0x0) {
      free(vBlacks->pArray);
      vBlacks->pArray = (int *)0x0;
    }
    free(vBlacks);
    if (vPPIs->pArray != (int *)0x0) {
      free(vPPIs->pArray);
      vPPIs->pArray = (int *)0x0;
    }
    uVar10 = 0xffffffff;
    pVVar17 = vPPIs;
    if (vPPIs == (Vec_Int_t *)0x0) {
      return -1;
    }
  }
  else {
    iVar8 = Vec_BitCount((Vec_Bit_t *)pVVar17);
    if (0 < (int)uVar12) {
      piVar18 = vBlacks->pArray;
      uVar27 = 0;
      do {
        if ((long)((Vec_Bit_t *)pVVar17)->nSize <= (long)uVar27) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)((Vec_Bit_t *)pVVar17)->pArray[uVar27 >> 5 & 0x7ffffff] >> ((uint)uVar27 & 0x1f)
            & 1) == 0) {
          uVar10 = piVar18[uVar27];
          if (((int)uVar10 < 0) || (local_48->vUnmark->nSize <= (int)uVar10)) goto LAB_00887afa;
          bVar7 = (byte)uVar10 & 0x1f;
          puVar1 = (uint *)(local_48->vUnmark->pArray + (uVar10 >> 5));
          *puVar1 = *puVar1 & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
        }
        uVar27 = uVar27 + 1;
      } while (uVar12 != uVar27);
    }
    if (vBlacks->pArray != (int *)0x0) {
      free(vBlacks->pArray);
      vBlacks->pArray = (int *)0x0;
    }
    free(vBlacks);
    if (vPPIs->pArray != (int *)0x0) {
      free(vPPIs->pArray);
      vPPIs->pArray = (int *)0x0;
    }
    if (vPPIs != (Vec_Int_t *)0x0) {
      free(vPPIs);
    }
    uVar10 = (uint)((int)uVar12 != iVar8);
    if (((Vec_Bit_t *)pVVar17)->pArray != (int *)0x0) {
      free(((Vec_Bit_t *)pVVar17)->pArray);
      ((Vec_Bit_t *)pVVar17)->pArray = (int *)0x0;
    }
  }
  free(pVVar17);
  return uVar10;
LAB_00887abc:
  __assertion = "Lit >= 0";
  pcVar15 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h";
  pcVar21 = "int Abc_LitNotCond(int, int)";
  goto LAB_00887ad1;
LAB_00887afa:
  __assertion = "i >= 0 && i < p->nSize";
  pcVar15 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h";
  pcVar21 = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
LAB_00887ad1:
  __assert_fail(__assertion,pcVar15,0x132,pcVar21);
}

Assistant:

int Wla_ManShrinkAbs( Wla_Man_t * pWla, int nFrames, int RunId )
{
    int i, Entry;
    int RetValue = 0;

    Vec_Int_t * vWhites = Wla_ManCollectNodes( pWla, 0 );
    Vec_Int_t * vBlacks = Wla_ManCollectNodes( pWla, 1 );
    Vec_Bit_t * vCoreMarks = Wlc_NtkProofReduce( pWla->p, pWla->pPars, nFrames, vWhites, vBlacks, RunId );

    if ( vCoreMarks == NULL )
    {
        Vec_IntFree( vWhites );
        Vec_IntFree( vBlacks );
        return -1;
    }

    RetValue = Vec_IntSize( vWhites ) != Vec_BitCount( vCoreMarks );

    Vec_IntForEachEntry( vWhites, Entry, i )
        if ( !Vec_BitEntry( vCoreMarks, i ) )
            Vec_BitWriteEntry( pWla->vUnmark, Entry, 0 );

    Vec_IntFree( vWhites );
    Vec_IntFree( vBlacks );
    Vec_BitFree( vCoreMarks );

    return RetValue;
}